

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O2

Result * CoreML::Result::featureTypeInvariantError
                   (Result *__return_storage_ptr__,
                   vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *allowed,
                   FeatureType *actual)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  Result(__return_storage_ptr__);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"Feature type invariant violation. Expected feature type ");
  FeatureType::toString_abi_cxx11_(&local_1d8,actual);
  poVar1 = std::operator<<(local_1a8,(string *)&local_1d8);
  std::operator<<(poVar1," to be one of: ");
  std::__cxx11::string::~string((string *)&local_1d8);
  lVar3 = 0;
  for (uVar2 = 0; uVar2 < (ulong)(*(long *)(allowed + 8) - *(long *)allowed >> 4); uVar2 = uVar2 + 1
      ) {
    FeatureType::toString_abi_cxx11_(&local_1d8,(FeatureType *)(*(long *)allowed + lVar3));
    std::operator<<(local_1a8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    if (uVar2 != (*(long *)(allowed + 8) - *(long *)allowed >> 4) - 1U) {
      std::operator<<(local_1a8,", ");
    }
    lVar3 = lVar3 + 0x10;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_message,(string *)&local_1d8)
  ;
  std::__cxx11::string::~string((string *)&local_1d8);
  __return_storage_ptr__->m_type = FEATURE_TYPE_INVARIANT_VIOLATION;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

Result Result::featureTypeInvariantError(
      const std::vector<FeatureType>& allowed,
      const FeatureType& actual) {

    Result out;
    std::stringstream ss;
    ss << "Feature type invariant violation. Expected feature type ";
    ss << actual.toString() << " to be one of: ";
    for (size_t i=0; i<allowed.size(); i++) {
      ss << allowed[i].toString();
      if (i != allowed.size() - 1) {
        ss << ", ";
      }
    }
    out.m_message = ss.str();
    out.m_type = ResultType::FEATURE_TYPE_INVARIANT_VIOLATION;
    return out;
  }